

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_schema.c
# Opt level: O1

reflection_Type_ref_t export_type(flatcc_builder_t *B,fb_value_t type)

{
  ushort uVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined4 uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  flatcc_builder_ref_t fVar11;
  int *piVar12;
  short *psVar13;
  char *pcVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  
  bVar6 = true;
  iVar10 = -1;
  lVar3 = type.field_0._0_8_;
  uVar7 = fb_missing_type;
  switch(type.type) {
  case 8:
LAB_00118d3b:
    cVar15 = '\x0e';
    bVar5 = true;
    break;
  case 9:
    uVar7 = type.field_0.st;
  default:
switchD_00118d37_caseD_c:
    type.field_0.st = uVar7;
LAB_00118df7:
    bVar5 = false;
    cVar15 = '\0';
    goto LAB_00118e35;
  case 10:
    cVar16 = '\r';
    goto LAB_00118e01;
  case 0xb:
    cVar15 = '\r';
LAB_00118e2e:
    type.field_0.st = fb_missing_type;
    bVar5 = false;
    break;
  case 0xf:
    iVar9 = *(int *)(lVar3 + 0xd0);
    uVar1 = *(ushort *)(lVar3 + 0x10);
    if (uVar1 < 2) {
      cVar15 = '\x0f';
      iVar10 = iVar9;
      goto LAB_00118e2e;
    }
    if (uVar1 == 4) {
      cVar15 = '\x10';
      iVar10 = iVar9;
      goto LAB_00118e2e;
    }
    if (uVar1 != 3) {
LAB_00118df3:
      uVar7 = fb_missing_type;
      goto switchD_00118d37_caseD_c;
    }
    type.field_0.st = *(fb_scalar_type_t *)(lVar3 + 0x50);
    iVar10 = iVar9;
    goto LAB_00118df7;
  case 0x10:
    iVar10 = *(int *)(lVar3 + 0xd0);
    uVar1 = *(ushort *)(lVar3 + 0x10);
    if (uVar1 < 2) {
      cVar16 = '\x0f';
    }
    else {
      if (uVar1 != 4) {
        if (uVar1 != 3) goto LAB_00118df3;
        type.field_0.st = *(fb_scalar_type_t *)(lVar3 + 0x50);
        goto LAB_00118d3b;
      }
      cVar16 = '\x10';
    }
LAB_00118e01:
    cVar15 = '\x0e';
    bVar5 = true;
    type.field_0.st = fb_missing_type;
    bVar6 = false;
    goto LAB_00118e37;
  case 0x11:
    cVar15 = '\x11';
    bVar4 = true;
    bVar6 = false;
    bVar5 = false;
    cVar16 = '\0';
    goto LAB_00118e3a;
  case 0x14:
    uVar1 = *(ushort *)(lVar3 + 0x10);
    type.field_0.st = fb_missing_type;
    if (uVar1 < 2) {
      cVar16 = '\x0f';
    }
    else if (uVar1 == 4) {
      cVar16 = '\x10';
    }
    else {
      cVar16 = '\0';
      type.field_0.st = fb_missing_type;
      if (uVar1 == 3) {
        type.field_0.st = *(fb_scalar_type_t *)(lVar3 + 0x50);
        cVar16 = '\0';
      }
    }
    iVar10 = *(int *)(lVar3 + 0xd0);
    cVar15 = '\x11';
    bVar4 = true;
    bVar6 = false;
    bVar5 = false;
    goto LAB_00118e3a;
  }
  bVar6 = false;
LAB_00118e35:
  cVar16 = '\0';
LAB_00118e37:
  bVar4 = false;
  type.len._0_2_ = 0;
LAB_00118e3a:
  if (type.field_0.st - fb_ulong < 0xc) {
    cVar8 = (&DAT_00145cd8)[type.field_0.st - fb_ulong];
  }
  else {
    cVar8 = '\0';
  }
  cVar2 = cVar16;
  if (cVar16 == '\0') {
    cVar2 = cVar8;
  }
  cVar17 = cVar16;
  if (bVar4) {
    cVar17 = cVar2;
  }
  if (bVar5) {
    cVar17 = cVar2;
  }
  if (bVar6) {
    cVar17 = cVar16;
    cVar15 = cVar8;
  }
  iVar9 = flatcc_builder_start_table(B,4);
  if (iVar9 != 0) {
    return 0;
  }
  if (iVar10 != -1) {
    piVar12 = (int *)flatcc_builder_table_add(B,2,4,4);
    if (piVar12 == (int *)0x0) {
      return 0;
    }
    *piVar12 = iVar10;
  }
  if ((short)type.len != 0) {
    psVar13 = (short *)flatcc_builder_table_add(B,3,2,2);
    if (psVar13 == (short *)0x0) {
      return 0;
    }
    *psVar13 = (short)type.len;
  }
  if (cVar15 != '\0') {
    pcVar14 = (char *)flatcc_builder_table_add(B,0,1,1);
    if (pcVar14 == (char *)0x0) {
      return 0;
    }
    *pcVar14 = cVar15;
  }
  if (cVar17 != '\0') {
    pcVar14 = (char *)flatcc_builder_table_add(B,1,1,1);
    if (pcVar14 == (char *)0x0) {
      return 0;
    }
    *pcVar14 = cVar17;
  }
  iVar10 = flatcc_builder_check_required(B,__reflection_Type_required,0);
  if (iVar10 != 0) {
    fVar11 = flatcc_builder_end_table(B);
    return fVar11;
  }
  __assert_fail("flatcc_builder_check_required(B, __reflection_Type_required, sizeof(__reflection_Type_required) / sizeof(__reflection_Type_required[0]) - 1)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/reflection/reflection_builder.h"
                ,0x19,"reflection_Type_ref_t reflection_Type_end(flatbuffers_builder_t *)");
}

Assistant:

static reflection_Type_ref_t export_type(flatcc_builder_t *B, fb_value_t type)
{
    fb_scalar_type_t st = fb_missing_type;
    int32_t index = -1;
    reflection_BaseType_enum_t base_type = BaseType(None);
    reflection_BaseType_enum_t element = BaseType(None);
    reflection_BaseType_enum_t primitive = BaseType(None);
    uint16_t fixed_length = 0;

    switch (type.type) {
    case vt_scalar_type:
        st = type.st;
        break;
    case vt_vector_type:
        st = type.st;
        base_type = BaseType(Vector);
        break;
    case vt_vector_string_type:
        element = BaseType(String);
        base_type = BaseType(Vector);
        break;
    case vt_vector_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            base_type = BaseType(Vector);
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Vector);
            element = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Vector);
            element = BaseType(Union);
            break;
        default:
            break;
        }
        break;
    case vt_string_type:
        base_type = BaseType(String);
        break;
    case vt_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Union);
            break;
        default:
            index = -1;
            break;
        }
        break;
    case vt_fixed_array_type:
        st = type.st;
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_string_type:
        break;
        element = BaseType(Byte);
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            element = BaseType(Obj);
            break;
        case fb_is_union:
            element = BaseType(Union);
            break;
        default:
            break;
        }
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    default:
        break;
    }
    /* If st is set, resolve scalar type and set it to base_type or element. */
    switch (st) {
    case fb_missing_type: break;
    case fb_ulong: primitive = BaseType(ULong); break;
    case fb_uint: primitive = BaseType(UInt); break;
    case fb_ushort: primitive = BaseType(UShort); break;
    case fb_ubyte: primitive = BaseType(UByte); break;
    case fb_bool: primitive = BaseType(Bool); break;
    case fb_long: primitive = BaseType(Long); break;
    case fb_int: primitive = BaseType(Int); break;
    case fb_short: primitive = BaseType(Short); break;
    case fb_byte: primitive = BaseType(Byte); break;
    case fb_double: primitive = BaseType(Double); break;
    case fb_float: primitive = BaseType(Float); break;
    /* TODO: Googles flatc tool does not have char arrays so we use Byte as element type */
    case fb_char: primitive = BaseType(Byte); break;
    default: break;
    }

    if (base_type == BaseType(None)) {
        base_type = primitive;
    } else if (base_type == BaseType(Vector) || base_type == BaseType(Array)) {
        if (element == BaseType(None)) {
            element = primitive;
        }
    }
    return reflection_Type_create(B, base_type, element, index, fixed_length);
}